

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall phoenix_evsa_t::evsa_data_t::_read(evsa_data_t *this)

{
  kstream *pkVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  evsa_variable_attributes_t *peVar5;
  evsa_entry_t *this_00;
  string local_68;
  string local_48;
  unique_ptr<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  local_18;
  evsa_data_t *local_10;
  evsa_data_t *this_local;
  
  local_10 = this;
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_guid_id = uVar3;
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_var_id = uVar3;
  peVar5 = (evsa_variable_attributes_t *)operator_new(0x40);
  evsa_variable_attributes_t::evsa_variable_attributes_t
            (peVar5,(this->super_kstruct).m__io,this,this->m__root);
  std::
  unique_ptr<phoenix_evsa_t::evsa_variable_attributes_t,std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>>
  ::unique_ptr<std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>,void>
            ((unique_ptr<phoenix_evsa_t::evsa_variable_attributes_t,std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>>
              *)&local_18,peVar5);
  std::
  unique_ptr<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  ::operator=(&this->m_attributes,&local_18);
  std::
  unique_ptr<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  ::~unique_ptr(&local_18);
  this->n_len_data_ext = true;
  peVar5 = attributes(this);
  bVar2 = evsa_variable_attributes_t::extended_header(peVar5);
  if (bVar2) {
    this->n_len_data_ext = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data_ext = uVar4;
  }
  this->n_data = true;
  peVar5 = attributes(this);
  bVar2 = evsa_variable_attributes_t::extended_header(peVar5);
  if (!bVar2) {
    this->n_data = false;
    pkVar1 = (this->super_kstruct).m__io;
    this_00 = _parent(this);
    uVar3 = evsa_entry_t::len_evsa_entry(this_00);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_48,pkVar1,(long)(int)(uVar3 - 0xc));
    std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  this->n_data_ext = true;
  peVar5 = attributes(this);
  bVar2 = evsa_variable_attributes_t::extended_header(peVar5);
  if (bVar2) {
    this->n_data_ext = false;
    pkVar1 = (this->super_kstruct).m__io;
    uVar4 = len_data_ext(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_68,pkVar1,(ulong)uVar4);
    std::__cxx11::string::operator=((string *)&this->m_data_ext,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void phoenix_evsa_t::evsa_data_t::_read() {
    m_guid_id = m__io->read_u2le();
    m_var_id = m__io->read_u2le();
    m_attributes = std::unique_ptr<evsa_variable_attributes_t>(new evsa_variable_attributes_t(m__io, this, m__root));
    n_len_data_ext = true;
    if (attributes()->extended_header()) {
        n_len_data_ext = false;
        m_len_data_ext = m__io->read_u4le();
    }
    n_data = true;
    if (!(attributes()->extended_header())) {
        n_data = false;
        m_data = m__io->read_bytes((_parent()->len_evsa_entry() - 12));
    }
    n_data_ext = true;
    if (attributes()->extended_header()) {
        n_data_ext = false;
        m_data_ext = m__io->read_bytes(len_data_ext());
    }
}